

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ConvexCornerOption __thiscall
ON_SubDFromMeshParameters::CopyConvexCornerTest
          (ON_SubDFromMeshParameters *this,ON_SubDFromMeshParameters source_parameters)

{
  ConvexCornerOption CVar1;
  
  CVar1 = GetConvexCornerOption(&source_parameters);
  if (AtMeshCorner < CVar1) {
    ON_SubDIncrementErrorCount();
    CVar1 = Unset;
  }
  this->m_convex_corner_option = CVar1;
  if (source_parameters.m_maximum_convex_corner_edge_count - 2 < 0xffef) {
    this->m_maximum_convex_corner_edge_count = source_parameters.m_maximum_convex_corner_edge_count;
  }
  if ((0.0 < source_parameters.m_maximum_convex_corner_angle_radians) &&
     (source_parameters.m_maximum_convex_corner_angle_radians < 3.141592653589793)) {
    this->m_maximum_convex_corner_angle_radians =
         source_parameters.m_maximum_convex_corner_angle_radians;
  }
  CVar1 = GetConvexCornerOption(this);
  return CVar1;
}

Assistant:

ON_SubDFromMeshParameters::ConvexCornerOption ON_SubDFromMeshParameters::CopyConvexCornerTest(
  ON_SubDFromMeshParameters source_parameters
  )
{
  SetConvexCornerOption(source_parameters.GetConvexCornerOption());
  SetMaximumConvexCornerEdgeCount(source_parameters.MaximumConvexCornerEdgeCount());
  SetMaximumConvexCornerAngleRadians(source_parameters.MaximumConvexCornerAngleRadians());
  return GetConvexCornerOption();
}